

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandRenode(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  uint fVerbose;
  uint fUseMv;
  uint fUseBdds;
  uint fUseCnfs;
  uint fUseSops;
  Abc_Ntk_t *pAVar3;
  ulong uVar4;
  undefined4 extraout_var_00;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  uint local_84;
  uint local_80;
  uint local_7c;
  ulong local_50;
  ulong local_48;
  undefined4 extraout_var;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  local_7c = 0;
  Extra_UtilGetoptReset();
  local_80 = 1;
  local_50 = 4;
  local_48 = 8;
  local_84 = 1;
  fUseBdds = 0;
  fUseSops = 0;
  fUseCnfs = 0;
  fUseMv = 0;
  fVerbose = 0;
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"KCFAabscivh"), iVar7 = globalUtilOptind, 0x60 < iVar1
          ) {
      switch(iVar1) {
      case 0x61:
        local_7c = local_7c ^ 1;
        break;
      case 0x62:
        fUseBdds = fUseBdds ^ 1;
        break;
      case 99:
        fUseCnfs = fUseCnfs ^ 1;
        break;
      case 100:
      case 0x65:
      case 0x66:
      case 0x67:
      case 0x68:
        goto switchD_0024e834_caseD_64;
      case 0x69:
        fUseMv = fUseMv ^ 1;
        break;
      default:
        if (iVar1 == 0x73) {
          fUseSops = fUseSops ^ 1;
        }
        else {
          if (iVar1 != 0x76) goto switchD_0024e834_caseD_64;
          fVerbose = fVerbose ^ 1;
        }
      }
    }
    if (iVar1 < 0x46) {
      if (iVar1 == 0x41) {
        if (globalUtilOptind < argc) {
          local_84 = atoi(argv[globalUtilOptind]);
          uVar2 = local_84;
          goto joined_r0x0024e8b0;
        }
        pcVar5 = "Command line switch \"-A\" should be followed by a positive integer.\n";
      }
      else {
        if (iVar1 != 0x43) {
          if (iVar1 == -1) {
            if (fUseCnfs + fUseMv + fUseSops + fUseBdds < 2) {
              if ((int)local_48 - 0x10U < 0xfffffff2) {
                Abc_Print(-1,"Incorrect LUT size (%d).\n",local_48 & 0xffffffff);
                return 1;
              }
              if ((int)local_50 - 0x1000U < 0xfffff001) {
                pcVar5 = "Incorrect number of cuts.\n";
              }
              else if (pAVar3 == (Abc_Ntk_t *)0x0) {
                pcVar5 = "Empty network.\n";
              }
              else if (pAVar3->ntkType == ABC_NTK_STRASH) {
                pAVar3 = Abc_NtkRenode(pAVar3,(int)local_48,(int)local_50,local_80,local_84,local_7c
                                       ,fUseBdds,fUseSops,fUseCnfs,fUseMv,fVerbose);
                if (pAVar3 != (Abc_Ntk_t *)0x0) {
                  Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
                  return 0;
                }
                pcVar5 = "Renoding has failed.\n";
              }
              else {
                pcVar5 = "Cannot renode a network that is not an AIG (run \"strash\").\n";
              }
            }
            else {
              pcVar5 = "Cannot optimize two parameters at the same time.\n";
            }
            iVar7 = -1;
            goto LAB_0024eb4d;
          }
          break;
        }
        if (globalUtilOptind < argc) {
          iVar1 = atoi(argv[globalUtilOptind]);
          uVar4 = CONCAT44(extraout_var,iVar1);
          local_50 = uVar4;
          goto LAB_0024e8ae;
        }
        pcVar5 = "Command line switch \"-C\" should be followed by an integer.\n";
      }
LAB_0024e9d1:
      Abc_Print(-1,pcVar5);
      break;
    }
    if (iVar1 == 0x46) {
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-F\" should be followed by a positive integer.\n";
        goto LAB_0024e9d1;
      }
      local_80 = atoi(argv[globalUtilOptind]);
      uVar2 = local_80;
    }
    else {
      if (iVar1 != 0x4b) break;
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-F\" should be followed by an integer.\n";
        goto LAB_0024e9d1;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      uVar4 = CONCAT44(extraout_var_00,iVar1);
      local_48 = uVar4;
LAB_0024e8ae:
      uVar2 = (uint)uVar4;
    }
joined_r0x0024e8b0:
    globalUtilOptind = iVar7 + 1;
  } while (-1 < (int)uVar2);
switchD_0024e834_caseD_64:
  Abc_Print(-2,"usage: renode [-KCFA <num>] [-sbciav]\n");
  Abc_Print(-2,"\t          transforms the AIG into a logic network with larger nodes\n");
  Abc_Print(-2,"\t          while minimizing the number of FF literals of the node SOPs\n");
  Abc_Print(-2,"\t-K <num>: the max cut size for renoding (2 < num < %d) [default = %d]\n",0x10,
            local_48);
  Abc_Print(-2,"\t-C <num>: the max number of cuts used at a node (0 < num < 2^12) [default = %d]\n"
            ,local_50);
  Abc_Print(-2,"\t-F <num>: the number of area flow recovery iterations (num >= 0) [default = %d]\n"
            ,(ulong)local_80);
  Abc_Print(-2,
            "\t-A <num>: the number of exact area recovery iterations (num >= 0) [default = %d]\n",
            (ulong)local_84);
  pcVar6 = "yes";
  pcVar5 = "yes";
  if (fUseSops == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-s      : toggles minimizing SOP cubes instead of FF lits [default = %s]\n",pcVar5
           );
  pcVar5 = "yes";
  if (fUseBdds == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-b      : toggles minimizing BDD nodes instead of FF lits [default = %s]\n",pcVar5
           );
  pcVar5 = "yes";
  if (fUseCnfs == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-c      : toggles minimizing CNF clauses instead of FF lits [default = %s]\n",
            pcVar5);
  pcVar5 = "yes";
  if (fUseMv == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-i      : toggles minimizing MV-SOP instead of FF lits [default = %s]\n",pcVar5);
  pcVar5 = "yes";
  if (local_7c == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-a      : toggles area-oriented mapping [default = %s]\n",pcVar5);
  if (fVerbose == 0) {
    pcVar6 = "no";
  }
  Abc_Print(-2,"\t-v      : print verbose information [default = %s]\n",pcVar6);
  pcVar5 = "\t-h      : print the command usage\n";
  iVar7 = -2;
LAB_0024eb4d:
  Abc_Print(iVar7,pcVar5);
  return 1;
}

Assistant:

int Abc_CommandRenode( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int nLutSize, nCutsMax, c;
    int nFlowIters, nAreaIters;
    int fArea;
    int fUseBdds;
    int fUseSops;
    int fUseCnfs;
    int fUseMv;
    int fVerbose;
    extern Abc_Ntk_t * Abc_NtkRenode( Abc_Ntk_t * pNtk, int nLutSize, int nCutsMax, int nFlowIters, int nAreaIters, int fArea, int fUseBdds, int fUseSops, int fUseCnfs, int fUseMv, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);

    // set defaults
    nLutSize   =  8;
    nCutsMax   =  4;
    nFlowIters =  1;
    nAreaIters =  1;
    fArea      =  0;
    fUseBdds   =  0;
    fUseSops   =  0;
    fUseCnfs   =  0;
    fUseMv     =  0;
    fVerbose   =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCFAabscivh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutSize < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nCutsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCutsMax < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nFlowIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFlowIters < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nAreaIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nAreaIters < 0 )
                goto usage;
            break;
        case 'a':
            fArea ^= 1;
            break;
        case 'b':
            fUseBdds ^= 1;
            break;
        case 's':
            fUseSops ^= 1;
            break;
        case 'c':
            fUseCnfs ^= 1;
            break;
        case 'i':
            fUseMv ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( fUseBdds + fUseSops + fUseCnfs + fUseMv > 1 )
    {
        Abc_Print( -1, "Cannot optimize two parameters at the same time.\n" );
        return 1;
    }

    if ( nLutSize < 2 || nLutSize > IF_MAX_FUNC_LUTSIZE )
    {
        Abc_Print( -1, "Incorrect LUT size (%d).\n", nLutSize );
        return 1;
    }

    if ( nCutsMax < 1 || nCutsMax >= (1<<12) )
    {
        Abc_Print( -1, "Incorrect number of cuts.\n" );
        return 1;
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Cannot renode a network that is not an AIG (run \"strash\").\n" );
        return 1;
    }

    // get the new network
    pNtkRes = Abc_NtkRenode( pNtk, nLutSize, nCutsMax, nFlowIters, nAreaIters, fArea, fUseBdds, fUseSops, fUseCnfs, fUseMv, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Renoding has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: renode [-KCFA <num>] [-sbciav]\n" );
    Abc_Print( -2, "\t          transforms the AIG into a logic network with larger nodes\n" );
    Abc_Print( -2, "\t          while minimizing the number of FF literals of the node SOPs\n" );
    Abc_Print( -2, "\t-K <num>: the max cut size for renoding (2 < num < %d) [default = %d]\n", IF_MAX_FUNC_LUTSIZE+1, nLutSize );
    Abc_Print( -2, "\t-C <num>: the max number of cuts used at a node (0 < num < 2^12) [default = %d]\n", nCutsMax );
    Abc_Print( -2, "\t-F <num>: the number of area flow recovery iterations (num >= 0) [default = %d]\n", nFlowIters );
    Abc_Print( -2, "\t-A <num>: the number of exact area recovery iterations (num >= 0) [default = %d]\n", nAreaIters );
    Abc_Print( -2, "\t-s      : toggles minimizing SOP cubes instead of FF lits [default = %s]\n", fUseSops? "yes": "no" );
    Abc_Print( -2, "\t-b      : toggles minimizing BDD nodes instead of FF lits [default = %s]\n", fUseBdds? "yes": "no" );
    Abc_Print( -2, "\t-c      : toggles minimizing CNF clauses instead of FF lits [default = %s]\n", fUseCnfs? "yes": "no" );
    Abc_Print( -2, "\t-i      : toggles minimizing MV-SOP instead of FF lits [default = %s]\n", fUseMv? "yes": "no" );
    Abc_Print( -2, "\t-a      : toggles area-oriented mapping [default = %s]\n", fArea? "yes": "no" );
    Abc_Print( -2, "\t-v      : print verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}